

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

exr_result_t
internal_huf_compress
          (uint64_t *encbytes,void *out,uint64_t outsz,uint16_t *raw,uint64_t nRaw,void *spare,
          uint64_t sparebytes)

{
  uint64_t **first;
  uint64_t *hcode;
  long *plVar1;
  ulong *puVar2;
  ushort uVar3;
  uint uVar4;
  int iVar6;
  uint64_t *puVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  undefined1 *puVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint8_t *out_1;
  undefined1 *puVar21;
  undefined1 *puVar22;
  uint64_t i;
  uint64_t uVar23;
  ulong uVar24;
  size_t holeIndex;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  int xnBits;
  uint uVar5;
  
  puVar21 = (undefined1 *)0x0;
  if (nRaw != 0) {
    if ((undefined *)sparebytes != &DAT_001c001c || outsz < 0x14) {
      return 3;
    }
    puVar14 = (undefined1 *)(outsz + (long)out);
    first = (uint64_t **)((long)spare + 0x100010);
    memset(spare,0,0x80008);
    for (uVar23 = 0; nRaw != uVar23; uVar23 = uVar23 + 1) {
      plVar1 = (long *)((long)spare + (ulong)raw[uVar23] * 8);
      *plVar1 = *plVar1 + 1;
    }
    hcode = (uint64_t *)((long)spare + 0x80008);
    uVar8 = 0xffffffffffffffff;
    do {
      uVar9 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar9;
    } while (*(long *)((long)spare + uVar8 * 8) == 0);
    puVar7 = (uint64_t *)((long)spare + uVar8 * 8);
    uVar20 = 0;
    uVar16 = 0;
    for (uVar11 = uVar8; uVar11 < 0x10001; uVar11 = uVar11 + 1) {
      *(int *)((long)spare + uVar11 * 4 + 0x180018) = (int)uVar11;
      if (*puVar7 != 0) {
        first[uVar16] = puVar7;
        uVar16 = (ulong)((int)uVar16 + 1);
        uVar20 = uVar11 & 0xffffffff;
      }
      puVar7 = puVar7 + 1;
    }
    uVar15 = (int)uVar20 + 1;
    puVar2 = (ulong *)((long)spare + (ulong)uVar15 * 8);
    *puVar2 = 1;
    *(ulong **)((long)spare + uVar16 * 8 + 0x100010) = puVar2;
    uVar17 = (int)uVar16 + 1;
    uVar11 = (ulong)uVar17;
    if (1 < uVar17) {
      holeIndex = uVar11 - 2 >> 1;
      do {
        adjust_heap(first,holeIndex,uVar11,first[holeIndex]);
        bVar27 = holeIndex != 0;
        holeIndex = holeIndex - 1;
      } while (bVar27);
    }
    memset(hcode,0,0x80008);
    while (1 < uVar11) {
      uVar16 = *(long *)((long)spare + 0x100010) - (long)spare;
      uVar24 = uVar16 >> 3;
      pop_heap(first,first + uVar11);
      uVar20 = uVar11 - 1;
      uVar26 = *(long *)((long)spare + 0x100010) - (long)spare;
      uVar25 = uVar26 >> 3;
      pop_heap(first,first + (uVar11 - 1));
      plVar1 = (long *)((long)spare + (uVar26 & 0x7fffffff8));
      *plVar1 = *plVar1 + *(long *)((long)spare + (uVar16 & 0x7fffffff8));
      intern_push_heap(first,uVar11 - 2,0,*(uint64_t **)((long)spare + uVar11 * 8 + 0x100000));
      do {
        uVar4 = (uint)uVar25;
        uVar11 = uVar25 & 0xffffffff;
        plVar1 = (long *)((long)spare + uVar11 * 8 + 0x80008);
        *plVar1 = *plVar1 + 1;
        uVar17 = *(uint *)((long)spare + uVar11 * 4 + 0x180018);
        uVar25 = (ulong)uVar17;
      } while (uVar17 != uVar4);
      *(int *)((long)spare + uVar11 * 4 + 0x180018) = (int)uVar24;
      do {
        uVar4 = (uint)uVar24;
        plVar1 = (long *)((long)spare + (uVar24 & 0xffffffff) * 8 + 0x80008);
        *plVar1 = *plVar1 + 1;
        uVar17 = *(uint *)((long)spare + (uVar24 & 0xffffffff) * 4 + 0x180018);
        uVar24 = (ulong)uVar17;
        uVar11 = uVar20;
      } while (uVar17 != uVar4);
    }
    hufCanonicalCodeTable(hcode);
    memcpy(spare,hcode,0x80008);
    iVar13 = 0;
    uVar11 = 0;
    puVar21 = (undefined1 *)((long)out + 0x14);
    while (uVar17 = (uint)uVar8, uVar17 <= uVar15) {
      uVar16 = *(ulong *)((long)spare + uVar8 * 8) & 0x3f;
      uVar20 = 0xfffffffffffffffb;
      if (uVar16 == 0) {
        while (((uVar24 = uVar20 + 6, uVar8 < uVar15 && (uVar24 < 0x105)) &&
               ((*(byte *)((long)spare + uVar8 * 8 + 8) & 0x3f) == 0))) {
          uVar8 = uVar8 + 1;
          uVar20 = uVar20 + 1;
        }
        uVar17 = (uint)uVar8;
        if (uVar24 < 2) goto LAB_0010b79e;
        if (uVar24 < 6) {
          uVar11 = uVar20 + 0x3f | uVar11 << 6;
          iVar13 = iVar13 + 6;
          while (7 < iVar13) {
            if (puVar14 <= puVar21) {
              return 4;
            }
            iVar13 = iVar13 + -8;
            *puVar21 = (char)(uVar11 >> ((byte)iVar13 & 0x3f));
            puVar21 = puVar21 + 1;
          }
        }
        else {
          uVar8 = uVar11 << 6 | 0x3f;
          iVar6 = iVar13 + 6;
          iVar13 = iVar13 + 0xe;
          while (7 < iVar6) {
            if (puVar14 <= puVar21) {
              return 4;
            }
            iVar6 = iVar6 + -8;
            *puVar21 = (char)(uVar8 >> ((byte)iVar6 & 0x3f));
            puVar21 = puVar21 + 1;
            iVar13 = iVar13 + -8;
          }
          uVar11 = uVar20 | uVar8 << 8;
          while (7 < iVar13) {
            if (puVar14 <= puVar21) {
              return 4;
            }
            iVar13 = iVar13 + -8;
            *puVar21 = (char)(uVar11 >> ((byte)iVar13 & 0x3f));
            puVar21 = puVar21 + 1;
          }
        }
      }
      else {
LAB_0010b79e:
        uVar11 = uVar16 | uVar11 << 6;
        iVar13 = iVar13 + 6;
        while (7 < iVar13) {
          if (puVar14 <= puVar21) {
            return 4;
          }
          iVar13 = iVar13 + -8;
          *puVar21 = (char)(uVar11 >> ((byte)iVar13 & 0x3f));
          puVar21 = puVar21 + 1;
        }
      }
      uVar8 = (ulong)(uVar17 + 1);
    }
    if (0 < iVar13) {
      if (puVar14 <= puVar21) {
        return 4;
      }
      *puVar21 = (char)(uVar11 << (8U - (char)iVar13 & 0x3f));
      puVar21 = puVar21 + 1;
    }
    uVar17 = (uint)*raw;
    uVar5 = (uint)*puVar2;
    uVar4 = uVar5 & 0x3f;
    iVar6 = uVar4 + 8;
    uVar11 = *puVar2 >> 6;
    iVar18 = 0;
    uVar8 = 1;
    iVar13 = 0;
    uVar20 = 0;
    puVar22 = puVar21;
    while( true ) {
      uVar16 = (ulong)uVar17;
      if (nRaw <= uVar8) break;
      uVar3 = raw[uVar8];
      if ((iVar18 == 0xff) || (uVar17 != uVar3)) {
        uVar24 = *(ulong *)((long)spare + uVar16 * 8);
        uVar17 = (uint)uVar24 & 0x3f;
        if ((int)(uVar17 + iVar6) < (int)(uVar17 * iVar18)) {
          uVar20 = uVar24 >> 6 | uVar20 << ((byte)uVar24 & 0x3f);
          iVar10 = uVar17 + iVar13;
          iVar19 = iVar13 + uVar4 + uVar17;
          iVar13 = iVar13 + iVar6 + uVar17;
          while (7 < iVar10) {
            if (puVar14 <= puVar22) {
              return 4;
            }
            iVar10 = iVar10 + -8;
            *puVar22 = (char)(uVar20 >> ((byte)iVar10 & 0x3f));
            puVar22 = puVar22 + 1;
            iVar19 = iVar19 + -8;
            iVar13 = iVar13 + -8;
          }
          uVar20 = uVar20 << (sbyte)uVar4 | uVar11;
          while (7 < iVar19) {
            if (puVar14 <= puVar22) {
              return 4;
            }
            iVar19 = iVar19 + -8;
            *puVar22 = (char)(uVar20 >> ((byte)iVar19 & 0x3f));
            puVar22 = puVar22 + 1;
            iVar13 = iVar13 + -8;
          }
          uVar20 = uVar20 << 8 | (long)iVar18;
          while (7 < iVar13) {
            if (puVar14 <= puVar22) {
              return 4;
            }
            *puVar22 = (char)(uVar20 >> ((byte)(iVar13 + -8) & 0x3f));
            puVar22 = puVar22 + 1;
            iVar13 = iVar13 + -8;
          }
        }
        else {
          while (-1 < iVar18) {
            iVar18 = iVar18 + -1;
            uVar24 = *(ulong *)((long)spare + uVar16 * 8);
            uVar20 = uVar24 >> 6 | uVar20 << ((byte)uVar24 & 0x3f);
            iVar13 = iVar13 + ((uint)uVar24 & 0x3f);
            while (7 < iVar13) {
              if (puVar14 <= puVar22) {
                return 4;
              }
              iVar13 = iVar13 + -8;
              *puVar22 = (char)(uVar20 >> ((byte)iVar13 & 0x3f));
              puVar22 = puVar22 + 1;
            }
          }
        }
        iVar18 = 0;
        uVar17 = (uint)uVar3;
      }
      else {
        iVar18 = iVar18 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    uVar8 = *(ulong *)((long)spare + uVar16 * 8);
    uVar17 = (uint)uVar8 & 0x3f;
    if ((int)(iVar6 + uVar17) < (int)(uVar17 * iVar18)) {
      uVar8 = uVar8 >> 6 | uVar20 << ((byte)uVar8 & 0x3f);
      iVar13 = uVar17 + iVar13;
      while (7 < iVar13) {
        if (puVar14 <= puVar22) {
          return 4;
        }
        iVar13 = iVar13 + -8;
        *puVar22 = (char)(uVar8 >> ((byte)iVar13 & 0x3f));
        puVar22 = puVar22 + 1;
      }
      uVar11 = uVar8 << (sbyte)uVar4 | uVar11;
      iVar13 = (uVar5 & 0x3f) + iVar13;
      while (7 < iVar13) {
        if (puVar14 <= puVar22) {
          return 4;
        }
        iVar13 = iVar13 + -8;
        *puVar22 = (char)(uVar11 >> ((byte)iVar13 & 0x3f));
        puVar22 = puVar22 + 1;
      }
      uVar20 = uVar11 << 8 | (long)iVar18;
      iVar13 = iVar13 + 8;
      while (7 < iVar13) {
        if (puVar14 <= puVar22) {
          return 4;
        }
        *puVar22 = (char)(uVar20 >> ((byte)(iVar13 + -8) & 0x3f));
        puVar22 = puVar22 + 1;
        iVar13 = iVar13 + -8;
      }
    }
    else {
      while (-1 < iVar18) {
        iVar18 = iVar18 + -1;
        uVar8 = *(ulong *)((long)spare + uVar16 * 8);
        uVar20 = uVar8 >> 6 | uVar20 << ((byte)uVar8 & 0x3f);
        iVar13 = iVar13 + ((uint)uVar8 & 0x3f);
        while (7 < iVar13) {
          if (puVar14 <= puVar22) {
            return 4;
          }
          iVar13 = iVar13 + -8;
          *puVar22 = (char)(uVar20 >> ((byte)iVar13 & 0x3f));
          puVar22 = puVar22 + 1;
        }
      }
    }
    if (iVar13 != 0) {
      if (puVar14 <= puVar22) {
        return 4;
      }
      *puVar22 = (char)(uVar20 << (8U - (char)iVar13 & 0x3f));
    }
    uVar8 = (long)iVar13 + ((long)puVar22 - (long)puVar21) * 8;
    if (uVar8 >> 0x20 != 0) {
      return 4;
    }
    *(char *)out = (char)uVar9;
    *(char *)((long)out + 1) = (char)(uVar9 >> 8);
    *(char *)((long)out + 2) = (char)(uVar9 >> 0x10);
    *(char *)((long)out + 3) = (char)(uVar9 >> 0x18);
    *(char *)((long)out + 4) = (char)uVar15;
    *(char *)((long)out + 5) = (char)(uVar15 >> 8);
    *(char *)((long)out + 6) = (char)(uVar15 >> 0x10);
    *(char *)((long)out + 7) = (char)(uVar15 >> 0x18);
    lVar12 = (long)puVar21 - ((long)out + 0x14);
    *(char *)((long)out + 8) = (char)lVar12;
    *(char *)((long)out + 9) = (char)((ulong)lVar12 >> 8);
    *(char *)((long)out + 10) = (char)((ulong)lVar12 >> 0x10);
    *(char *)((long)out + 0xb) = (char)((ulong)lVar12 >> 0x18);
    *(char *)((long)out + 0xc) = (char)uVar8;
    *(char *)((long)out + 0xd) = (char)(uVar8 >> 8);
    *(char *)((long)out + 0xe) = (char)(uVar8 >> 0x10);
    *(char *)((long)out + 0xf) = (char)(uVar8 >> 0x18);
    puVar21 = puVar21 + ((ulong)((int)uVar8 + 7U >> 3) - (long)out);
    *(undefined4 *)((long)out + 0x10) = 0;
  }
  *encbytes = (uint64_t)puVar21;
  return 0;
}

Assistant:

exr_result_t
internal_huf_compress (
    uint64_t*       encbytes,
    void*           out,
    uint64_t        outsz,
    const uint16_t* raw,
    uint64_t        nRaw,
    void*           spare,
    uint64_t        sparebytes)
{
    exr_result_t rv;
    uint64_t*    freq;
    uint32_t*    hlink;
    uint64_t**   fHeap;
    uint64_t*    scode;
    uint32_t     im = 0;
    uint32_t     iM = 0;
    uint32_t     tableLength, nBits, dataLength;
    uint8_t*     dataStart;
    uint8_t*     compressed = (uint8_t*) out;
    uint8_t*     tableStart = compressed + 20;
    uint8_t*     tableEnd   = tableStart;
    uint8_t*     maxcompout = compressed + outsz;

    if (nRaw == 0)
    {
        *encbytes = 0;
        return EXR_ERR_SUCCESS;
    }

    if (outsz < 20) return EXR_ERR_INVALID_ARGUMENT;
    if (sparebytes != internal_exr_huf_compress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    freq  = (uint64_t*) spare;
    scode = freq + HUF_ENCSIZE;
    fHeap = (uint64_t**) (scode + HUF_ENCSIZE);
    hlink = (uint32_t*) (fHeap + HUF_ENCSIZE);

    countFrequencies (freq, raw, nRaw);

    hufBuildEncTable (freq, &im, &iM, hlink, fHeap, scode);

    rv = hufPackEncTable (freq, im, iM, &tableEnd, maxcompout);

    if (rv != EXR_ERR_SUCCESS) return rv;
    tableLength =
        (uint32_t) (((uintptr_t) tableEnd) - ((uintptr_t) tableStart));
    dataStart = tableEnd;

    rv = hufEncode (freq, raw, nRaw, iM, dataStart, maxcompout, &nBits);
    if (rv != EXR_ERR_SUCCESS) return rv;

    dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    *encbytes =
        (((uintptr_t) dataStart) + ((uintptr_t) dataLength) -
         ((uintptr_t) compressed));
    return EXR_ERR_SUCCESS;
}